

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::TextureBuffer::TextureBuffer
          (TextureBuffer *this,int dim_,TextureFormat format_,uint sizeX_,uint sizeY_,uint sizeZ_)

{
  uint64_t uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [16];
  string *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__TextureBuffer_0098baa0;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x14) = in_R8D;
  *(undefined4 *)(in_RDI + 3) = in_R9D;
  uVar1 = Engine::getNextUniqueID(render::engine);
  in_RDI[4] = uVar1;
  if (0x400000 < *(uint *)(in_RDI + 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"OpenGL error: invalid texture dimensions",&local_41);
    exception(in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if ((1 < *(int *)(in_RDI + 1)) && (0x400000 < *(uint *)((long)in_RDI + 0x14))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"OpenGL error: invalid texture dimensions",&local_79);
    exception(in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return;
}

Assistant:

TextureBuffer::TextureBuffer(int dim_, TextureFormat format_, unsigned int sizeX_, unsigned int sizeY_,
                             unsigned int sizeZ_)
    : dim(dim_), format(format_), sizeX(sizeX_), sizeY(sizeY_), sizeZ(sizeZ_),
      uniqueID(render::engine->getNextUniqueID()) {
  if (sizeX > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
  if (dim > 1 && sizeY > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
}